

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

void __thiscall Clasp::Asp::LogicProgram::transformExtended(LogicProgram *this)

{
  RuleBuilder *this_00;
  bool bVar1;
  LogicProgram *this_01;
  uint uVar2;
  RuleTransform tm;
  Lit_t auxB;
  Atom_t aux;
  Rule r;
  Rule rAux2;
  RuleTransform local_110;
  size_type local_104;
  Atom_t local_100;
  Atom_t local_fc;
  undefined1 *local_f8;
  Rule_t local_f0;
  LitSpan local_b8;
  Rule local_a8;
  Rule_t local_68;
  
  local_104 = (this->atoms_).ebo_.size;
  RuleTransform::RuleTransform(&local_110,this);
  if ((this->extended_).ebo_.size != 0) {
    local_f8 = &(this->super_ProgramBuilder).field_0x1c;
    uVar2 = 0;
    do {
      Potassco::RuleBuilder::rule(&local_f0,(this->extended_).ebo_.buf[uVar2]);
      *(int *)(local_f8 + (ulong)local_f0.ht.val_ * 4 + (long)this->statsId_ * 0x14) =
           *(int *)(local_f8 + (ulong)local_f0.ht.val_ * 4 + (long)this->statsId_ * 0x14) + -1;
      *(int *)(&this->field_0x44 + (ulong)local_f0.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
           *(int *)(&this->field_0x44 + (ulong)local_f0.bt.val_ * 4 + (long)this->statsId_ * 0xc) +
           -1;
      if (((ulong)local_f0.bt.val_ == 0) ||
         ((local_f0.ht.val_ == Disjunctive && (local_f0.head.size < 2)))) {
        RuleTransform::transform(&local_110,&local_f0,strategy_default);
      }
      else {
        local_100 = newAtom(this);
        local_a8.field_3._16_8_ = local_f0.field_3._16_8_;
        local_a8.field_3.cond.first = local_f0.field_3.cond.first;
        local_a8.field_3.cond.size = local_f0.field_3.cond.size;
        local_a8._0_8_ = (ulong)(uint)local_f0._4_4_ << 0x20;
        local_a8.head.first = &local_fc;
        local_a8.head.size = 1;
        local_b8.first = (int *)&local_100;
        local_b8.size = 1;
        local_fc = local_100;
        Potassco::Rule_t::normal(&local_68,local_f0.ht,&local_f0.head,&local_b8);
        this_01 = this;
        bVar1 = handleNatively(this,&local_a8);
        if (bVar1) {
          addRule(this,&local_a8);
        }
        else {
          bVar1 = transformNoAux(this_01,&local_a8);
          RuleTransform::transform(&local_110,&local_a8,(uint)bVar1);
        }
        bVar1 = handleNatively(this,&local_68);
        if (bVar1) {
          addRule(this,&local_68);
        }
        else {
          RuleTransform::transform(&local_110,&local_68,strategy_default);
        }
      }
      this_00 = (this->extended_).ebo_.buf[uVar2];
      if (this_00 != (RuleBuilder *)0x0) {
        Potassco::RuleBuilder::~RuleBuilder(this_00);
      }
      operator_delete(this_00);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (this->extended_).ebo_.size);
  }
  (this->extended_).ebo_.size = 0;
  *(size_type *)&this->field_0x60 =
       *(int *)&this->field_0x60 + ((this->atoms_).ebo_.size - local_104);
  RuleTransform::~RuleTransform(&local_110);
  return;
}

Assistant:

void LogicProgram::transformExtended() {
	uint32 a = numAtoms();
	RuleTransform tm(*this);
	for (RuleList::size_type i = 0; i != extended_.size(); ++i) {
		Rule r = extended_[i]->rule();
		upStat(r.ht, -1);
		upStat(r.bt, -1);
		if (r.normal() || (r.ht == Head_t::Disjunctive && Potassco::size(r.head) < 2)) {
			tm.transform(r);
		}
		else {
			using Potassco::Lit_t;
			Atom_t aux = newAtom();
			Lit_t auxB = Potassco::lit(aux);
			Rule rAux1 = r; // aux :- body
			rAux1.ht   = Head_t::Disjunctive;
			rAux1.head = Potassco::toSpan(&aux, 1);
			Rule rAux2 = Rule::normal(r.ht, r.head, Potassco::toSpan(&auxB, 1));  // head :- auxB
			if (handleNatively(rAux1)) { addRule(rAux1); }
			else {
				RuleTransform::Strategy st = transformNoAux(rAux1) ? RuleTransform::strategy_no_aux : RuleTransform::strategy_default;
				tm.transform(rAux1, st);
			}
			if (handleNatively(rAux2)) { addRule(rAux2); }
			else                       { tm.transform(rAux2); }
		}
		delete extended_[i];
	}
	extended_.clear();
	incTrAux(numAtoms() - a);
}